

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O1

void match_ctx_init(match_ctx *ctx,membuf *inbuf,int max_len,int max_offset,int use_imprecise_rle)

{
  undefined1 *__nmemb;
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  byte *pbVar4;
  uchar *puVar5;
  matchp pmVar6;
  bool bVar7;
  int offset;
  pre_calc (*papVar8) [1];
  unsigned_short *puVar9;
  unsigned_short *puVar10;
  int *piVar11;
  uint *puVar12;
  uint *puVar13;
  match_node *pmVar14;
  long lVar15;
  long lVar16;
  unsigned_short uVar17;
  ulong uVar18;
  int iVar19;
  match_node *pmVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  uint uVar25;
  byte *pbVar26;
  long lVar27;
  uint local_74;
  matchp local_60;
  matchp local_58;
  ulong local_50;
  match_node *local_48;
  long local_40;
  long local_38;
  
  uVar24 = inbuf->len;
  pmVar20 = (match_node *)(long)(int)uVar24;
  pbVar4 = (byte *)inbuf->buf;
  __nmemb = (undefined1 *)((long)&pmVar20->index + 1);
  papVar8 = (pre_calc (*) [1])calloc((size_t)__nmemb,0x10);
  ctx->info = papVar8;
  puVar9 = (unsigned_short *)calloc((size_t)__nmemb,2);
  ctx->rle = puVar9;
  puVar10 = (unsigned_short *)calloc((size_t)__nmemb,2);
  ctx->rle_r = puVar10;
  ctx->m_pool[0].chunk_size = 0x10;
  ctx->m_pool[0].chunk = -1;
  ctx->m_pool[0].chunk_pos = 0x1ffff0;
  ctx->m_pool[0].chunk_max = 0x1ffff0;
  ctx->max_offset = max_offset;
  ctx->max_len = max_len;
  ctx->buf = pbVar4;
  ctx->len = uVar24;
  if (1 < (long)pmVar20) {
    pmVar14 = (match_node *)0x1;
    do {
      if (pbVar4[(long)pmVar14] == (pbVar4 + -1)[(long)pmVar14]) {
        uVar17 = puVar9[(long)((long)&pmVar14[-1].next + 7)] + 1;
      }
      else {
        uVar17 = 0;
      }
      puVar9[(long)pmVar14] = uVar17;
      pmVar14 = (match_node *)((long)&pmVar14->index + 1);
    } while (pmVar20 != pmVar14);
  }
  if (1 < (int)uVar24) {
    lVar15 = (ulong)(uVar24 - 2) + 1;
    do {
      if (puVar9[lVar15 + -1] < puVar9[lVar15]) {
        uVar17 = puVar10[lVar15] + 1;
      }
      else {
        uVar17 = 0;
      }
      puVar10[lVar15 + -1] = uVar17;
      lVar16 = lVar15 + -1;
      bVar7 = 0 < lVar15;
      lVar15 = lVar16;
    } while (lVar16 != 0 && bVar7);
  }
  local_50 = (ulong)uVar24;
  lVar15 = local_50 * 2;
  local_40 = local_50 + 1;
  local_38 = local_50 * 8 + -8;
  uVar24 = 0;
  local_48 = pmVar20;
  do {
    memset(match_ctx_init::rle_map,0,0x10000);
    if (0 < (int)pmVar20) {
      lVar16 = 0;
      uVar21 = 0;
      pmVar20 = (match_node *)0x0;
      pbVar26 = pbVar4;
      do {
        if (((uVar24 == *pbVar26) &&
            ((uVar22 = (ulong)*(ushort *)((long)ctx->rle + lVar16),
             match_ctx_init::rle_map[uVar22] != '\0' ||
             (*(ushort *)((long)ctx->rle_r + lVar16) < 0x11)))) &&
           ((use_imprecise_rle == 0 ||
            ((uVar22 == 0 || (*(short *)((long)ctx->rle_r + lVar16) == 0)))))) {
          pmVar14 = (match_node *)chunkpool_malloc(ctx->m_pool);
          pmVar14->index = uVar21;
          pmVar14->next = (match_node *)0x0;
          match_ctx_init::rle_map[uVar22] = '\x01';
          if (~LOG_FATAL < G_log_level) {
            G_log_log_level = LOG_DUMP;
            log_log_default("0) c = %d, added np idx %d -> %d\n",uVar24,(ulong)uVar21,0);
          }
          if (pmVar20 != (match_node *)0x0) {
            if (~LOG_FATAL < G_log_level) {
              G_log_log_level = LOG_DUMP;
              log_log_default("1) c = %d, pointed np idx %d -> %d\n",uVar24,
                              (ulong)(uint)pmVar20->index,(ulong)uVar21);
            }
            pmVar20->next = pmVar14;
          }
          (&(*ctx->info)[0].single)[lVar16] = pmVar14;
          pmVar20 = pmVar14;
        }
        uVar21 = uVar21 + 1;
        lVar16 = lVar16 + 2;
        pbVar26 = pbVar26 + 1;
      } while (lVar15 != lVar16);
    }
    memset(match_ctx_init::rle_map,0,0x10000);
    pmVar20 = local_48;
    iVar19 = (int)local_48;
    if (0 < iVar19) {
      puVar13 = (uint *)0x0;
      lVar16 = local_38;
      lVar27 = local_40;
      do {
        if (uVar24 == pbVar4[lVar27 + -2]) {
          puVar12 = *(uint **)((long)&(*ctx->info)[0].single + lVar16 * 2);
          if ((((puVar12 == (uint *)0x0) && (puVar12 = puVar13, (ulong)ctx->rle_r[lVar27 + -2] != 0)
               ) && (match_ctx_init::rle_map[ctx->rle_r[lVar27 + -2]] != '\0')) &&
             (puVar13 != (uint *)0x0)) {
            piVar11 = (int *)chunkpool_malloc(ctx->m_pool);
            *piVar11 = (int)lVar27 + -2;
            *(uint **)(piVar11 + 2) = puVar13;
            *(int **)((long)&(*ctx->info)[0].single + lVar16 * 2) = piVar11;
            if (~LOG_ERROR < G_log_level) {
              G_log_log_level = LOG_DEBUG;
              log_log_default("2) c = %d, added np idx %d -> %d\n",(ulong)uVar24,
                              (ulong)((int)lVar27 - 2),(ulong)*puVar13);
            }
          }
          puVar13 = puVar12;
          if (ctx->rle_r[lVar27 + -2] == 0) {
            match_ctx_init::rle_map[(ushort)(ctx->rle[lVar27 + -2] + 1)] = '\x01';
          }
        }
        lVar27 = lVar27 + -1;
        lVar16 = lVar16 + -8;
      } while (1 < lVar27);
    }
    uVar24 = uVar24 + 1;
  } while (uVar24 != 0x100);
  if (0 < iVar19) {
    do {
      uVar22 = local_50 - 1;
      puVar5 = ctx->buf;
      local_58 = (matchp)0x0;
      if (~LOG_FATAL < G_log_level) {
        G_log_log_level = LOG_DUMP;
        log_log_default("index %d, char \'%c\', rle %d, rle_r %d\n",uVar22 & 0xffffffff,
                        (ulong)puVar5[uVar22],(ulong)ctx->rle[uVar22],(ulong)ctx->rle_r[uVar22]);
      }
      local_60 = (matchp)chunkpool_malloc(ctx->m_pool);
      local_60->offset = 0;
      local_60->len = 1;
      local_60->next = (match *)0x0;
      local_40 = uVar22 * 0x10;
      pmVar20 = ctx->info[uVar22][0].single;
      local_58 = local_60;
      if (pmVar20 == (match_node *)0x0) {
        pmVar20 = (match_node *)0x0;
      }
      else {
        pmVar20 = pmVar20->next;
      }
      for (; pmVar20 != (match_node *)0x0; pmVar20 = pmVar20->next) {
        iVar19 = (int)uVar22;
        bVar7 = true;
        if (pmVar20->index <= ctx->max_offset + iVar19) {
          if (~LOG_FATAL < G_log_level) {
            G_log_log_level = LOG_DUMP;
            log_log_default("find lengths for index %d to index %d\n",uVar22 & 0xffffffff,
                            (ulong)(uint)pmVar20->index);
          }
          if (local_60->offset == 0) {
            local_74 = 0;
          }
          else {
            local_74 = (uint)local_60->len;
          }
          if (~LOG_FATAL < G_log_level) {
            G_log_log_level = LOG_DUMP;
            log_log_default("0) comparing with current best [%d] off %d len %d\n",
                            uVar22 & 0xffffffff,(ulong)local_60->offset,(ulong)local_74);
          }
          iVar3 = pmVar20->index;
          offset = iVar3 - iVar19;
          local_48 = pmVar20;
          if (1 < local_74) {
            uVar21 = (int)local_50 - local_74;
            uVar24 = local_74;
            do {
              if (puVar5[(int)uVar21] != puVar5[(int)(offset + uVar21)]) {
                bVar7 = false;
                pmVar20 = local_48;
                goto LAB_00110925;
              }
              uVar1 = ctx->rle_r[(int)uVar21];
              uVar2 = ctx->rle_r[(int)(offset + uVar21)];
              if (uVar1 < uVar2) {
                uVar2 = uVar1;
              }
              uVar25 = (uint)uVar2;
              if (~LOG_FATAL < G_log_level) {
                G_log_log_level = LOG_DUMP;
                log_log_default("1) compared sucesssfully [%d] %d %d\n",uVar22,(ulong)uVar21,
                                (ulong)(uVar21 + uVar25));
              }
              uVar24 = uVar24 - (uVar25 + 1);
              uVar21 = uVar21 + uVar25 + 1;
            } while (1 < (int)uVar24);
          }
          if (offset < 0x11) {
            local_60 = (matchp)chunkpool_malloc(ctx->m_pool);
            local_60->len = 1;
            local_60->offset = (unsigned_short)offset;
            local_60->next = local_58;
            local_58 = local_60;
          }
          uVar21 = iVar19 - local_74;
          uVar24 = local_74;
          if ((-1 < (int)uVar21) && ((int)local_74 <= ctx->max_len)) {
            uVar25 = iVar3 - local_74;
            uVar23 = (ulong)uVar21;
            uVar21 = local_74;
            while (uVar18 = uVar23, uVar24 = uVar21, puVar5[uVar23] == puVar5[(int)uVar25]) {
              if (~LOG_FATAL < G_log_level) {
                G_log_log_level = LOG_DUMP;
                log_log_default("2) compared sucesssfully [%d] %d %d\n",uVar22,uVar23 & 0xffffffff,
                                (ulong)uVar25);
              }
              uVar24 = uVar21 + 1;
              uVar18 = uVar23 - 1;
              if (((long)uVar23 < 1) ||
                 (uVar25 = uVar25 - 1, bVar7 = ctx->max_len <= (int)uVar21, uVar23 = uVar18,
                 uVar21 = uVar24, bVar7)) break;
            }
            uVar21 = (uint)uVar18;
          }
          if (local_74 < uVar24) {
            local_60 = match_new(ctx,&local_58,iVar19 - uVar21,offset);
          }
          bVar7 = (int)uVar21 < 0 || ctx->max_len < (int)uVar24;
          pmVar20 = local_48;
        }
LAB_00110925:
        if (bVar7) break;
      }
      if (~LOG_ERROR < G_log_level) {
        G_log_log_level = LOG_DEBUG;
        log_log_default("adding matches for index %d to cache\n",uVar22 & 0xffffffff);
      }
      pmVar6 = local_58;
      dump_matches(0x1e,local_58);
      *(matchp *)((long)&(*ctx->info)[0].cache + local_40) = pmVar6;
      bVar7 = 1 < (long)local_50;
      local_50 = uVar22;
    } while (bVar7);
  }
  return;
}

Assistant:

void match_ctx_init(match_ctx ctx,         /* IN/OUT */
                    struct membuf *inbuf,  /* IN */
                    int max_len,           /* IN */
                    int max_offset,        /* IN */
                    int use_imprecise_rle) /* IN */
{
    struct match_node *np;

    int buf_len = membuf_memlen(inbuf);
    const unsigned char *buf = membuf_get(inbuf);

    int c, i;
    int val;

    ctx->info = calloc(buf_len + 1, sizeof(*ctx->info));
    ctx->rle = calloc(buf_len + 1, sizeof(*ctx->rle));
    ctx->rle_r = calloc(buf_len + 1, sizeof(*ctx->rle_r));

    chunkpool_init(ctx->m_pool, sizeof(match));

    ctx->max_offset = max_offset;
    ctx->max_len = max_len;

    ctx->buf = buf;
    ctx->len = buf_len;

    val = buf[0];
    for (i = 1; i < buf_len; ++i)
    {
        if (buf[i] == val)
        {
            int len = ctx->rle[i - 1] + 1;
            if(len > 65535)
            {
                len = 0;
            }
            ctx->rle[i] = len;
        } else
        {
            ctx->rle[i] = 0;
        }
        val = buf[i];
    }

    for (i = buf_len - 2; i >= 0; --i)
    {
        if (ctx->rle[i] < ctx->rle[i + 1])
        {
            ctx->rle_r[i] = ctx->rle_r[i + 1] + 1;
        } else
        {
            ctx->rle_r[i] = 0;
        }
    }

    /* add extra nodes to rle sequences */
    for(c = 0; c < 256; ++c)
    {
        static char rle_map[65536];
        struct match_node *prev_np;
        unsigned short int rle_len;

        /* for each possible rle char */
        memset(rle_map, 0, sizeof(rle_map));
        prev_np = NULL;
        for (i = 0; i < buf_len; ++i)
        {
            /* must be the correct char */
            if(buf[i] != c)
            {
                continue;
            }

            rle_len = ctx->rle[i];
            if(!rle_map[rle_len] && ctx->rle_r[i] > 16)
            {
                /* no previous lengths and not our primary length*/
                continue;
            }

            if (use_imprecise_rle &&
                ctx->rle_r[i] != 0 && ctx->rle[i] != 0)
            {
                continue;
            }

            np = chunkpool_malloc(ctx->m_pool);
            np->index = i;
            np->next = NULL;
            rle_map[rle_len] = 1;

            LOG(LOG_DUMP, ("0) c = %d, added np idx %d -> %d\n", c, i, 0));

            /* if we have a previous entry, let's chain it together */
            if(prev_np != NULL)
            {
                LOG(LOG_DUMP, ("1) c = %d, pointed np idx %d -> %d\n",
                                c, prev_np->index, i));
                prev_np->next = np;
            }

            ctx->info[i]->single = np;
            prev_np = np;
        }

        memset(rle_map, 0, sizeof(rle_map));
        prev_np = NULL;
        for (i = buf_len - 1; i >= 0; --i)
        {
            /* must be the correct char */
            if(buf[i] != c)
            {
                continue;
            }

            rle_len = ctx->rle_r[i];
            np = ctx->info[i]->single;
            if(np == NULL)
            {
                if(rle_map[rle_len] && prev_np != NULL && rle_len > 0)
                {
                    np = chunkpool_malloc(ctx->m_pool);
                    np->index = i;
                    np->next = prev_np;
                    ctx->info[i]->single = np;

                    LOG(LOG_DEBUG, ("2) c = %d, added np idx %d -> %d\n",
                                    c, i, prev_np->index));
                }
            }
            else
            {
                prev_np = np;
            }

            if(ctx->rle_r[i] > 0)
            {
                continue;
            }
            rle_len = ctx->rle[i] + 1;
            rle_map[rle_len] = 1;
        }
    }


    for (i = buf_len - 1; i >= 0; --i)
    {
        const_matchp matches;

        /* let's populate the cache */
        matches = matches_calc(ctx, i);

        /* add to cache */
        ctx->info[i]->cache = matches;

    }

}